

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::LinearConstraint::setControlConstraintMatrix
          (LinearConstraint *this,MatrixDynSize *constraintMatrix)

{
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_> *this_00;
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_> *psVar1;
  char *pcVar2;
  Constraint *in_RDI;
  bool bVar3;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  this_00 = (shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_> *)
            iDynTree::MatrixDynSize::rows();
  psVar1 = (shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_> *)
           Constraint::constraintSize(in_RDI);
  bVar3 = this_00 == psVar1;
  if (bVar3) {
    std::
    make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,iDynTree::MatrixDynSize_const&>
              ((MatrixDynSize *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>>::operator=
              (this_00,(shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_>
                        *)in_RDI);
    std::shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_>::
    ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_>
                 *)0x37e1fc);
    *(undefined1 *)((long)in_RDI[1]._vptr_Constraint + 1) = 1;
  }
  else {
    Constraint::name_abi_cxx11_(in_RDI);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError
              (pcVar2,"setControlConstraintMatrix",
               "The number of rows of the constraintMatrix is different from the specified constraint size."
              );
  }
  return bVar3;
}

Assistant:

bool LinearConstraint::setControlConstraintMatrix(const MatrixDynSize &constraintMatrix)
        {
            if (constraintMatrix.rows() != constraintSize()) {
                reportError(name().c_str(), "setControlConstraintMatrix", "The number of rows of the constraintMatrix is different from the specified constraint size.");
                return false;
            }

            m_pimpl->controlConstraintMatrix = std::make_shared<TimeInvariantMatrix>(constraintMatrix);
            m_pimpl->constrainsControl = true;

            return true;
        }